

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FAT12.cpp
# Opt level: O2

void __thiscall Storage::Disk::FAT12::FAT12(FAT12 *this,string *file_name)

{
  FileHolder *this_00;
  int sectors_per_track;
  long lVar1;
  uint16_t uVar2;
  uint16_t uVar3;
  uint uVar4;
  stat *psVar5;
  undefined4 *puVar6;
  int iVar7;
  
  MFMSectorDump::MFMSectorDump(&this->super_MFMSectorDump,file_name);
  (this->super_MFMSectorDump).super_DiskImage._vptr_DiskImage =
       (_func_int **)&PTR__MFMSectorDump_0058e4a0;
  this_00 = &(this->super_MFMSectorDump).file_;
  psVar5 = FileHolder::stats(this_00);
  lVar1 = psVar5->st_size;
  if (lVar1 < 0x200) {
    puVar6 = (undefined4 *)__cxa_allocate_exception(4);
    *puVar6 = 0xfffffffe;
    __cxa_throw(puVar6,&Error::typeinfo,0);
  }
  FileHolder::seek(this_00,0xb,0);
  uVar2 = FileHolder::get16le(this_00);
  this->sector_size_ = (uint)uVar2;
  FileHolder::seek(this_00,0x13,0);
  uVar2 = FileHolder::get16le(this_00);
  FileHolder::seek(this_00,0x18,0);
  uVar3 = FileHolder::get16le(this_00);
  this->sector_count_ = (uint)uVar3;
  uVar3 = FileHolder::get16le(this_00);
  this->head_count_ = (uint)uVar3;
  uVar4 = (uint)uVar2;
  if (lVar1 == (int)(this->sector_size_ * uVar4)) {
    sectors_per_track = this->sector_count_;
    lVar1 = (long)(int)((uint)uVar3 * sectors_per_track);
    if ((int)((long)(ulong)uVar4 % lVar1) == 0) {
      this->track_count_ = (int)((long)(ulong)uVar4 / lVar1);
      iVar7 = 2;
      while( true ) {
        if (iVar7 == 5) {
          puVar6 = (undefined4 *)__cxa_allocate_exception(4);
          *puVar6 = 0xfffffffe;
          __cxa_throw(puVar6,&Error::typeinfo,0);
        }
        if (0x80 << ((byte)iVar7 & 0x1f) == this->sector_size_) break;
        iVar7 = iVar7 + 1;
      }
      MFMSectorDump::set_geometry
                (&this->super_MFMSectorDump,sectors_per_track,(byte)iVar7,'\x01',
                 (10 < sectors_per_track) + Double);
      return;
    }
  }
  puVar6 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar6 = 0xfffffffe;
  __cxa_throw(puVar6,&Error::typeinfo,0);
}

Assistant:

FAT12::FAT12(const std::string &file_name) :
	MFMSectorDump(file_name) {
	// The only sanity check here is whether a sensible
	// geometry is encoded in the first sector, or can be guessed.
	const auto file_size = file_.stats().st_size;

	if(file_size < 512) throw Error::InvalidFormat;

	// Inspect the FAT.
	file_.seek(11, SEEK_SET);
	sector_size_ = file_.get16le();
	file_.seek(19, SEEK_SET);
	const uint16_t total_sectors = file_.get16le();
	file_.seek(24, SEEK_SET);
	sector_count_ = file_.get16le();
	head_count_ = file_.get16le();

	// Throw if there would seemingly be an incomplete track.
	if(file_size != total_sectors*sector_size_) throw Error::InvalidFormat;
	if(total_sectors % (head_count_ * sector_count_)) throw Error::InvalidFormat;
	track_count_ = int(total_sectors / (head_count_ * sector_count_));

	// Check that there is a valid power-of-two sector size.
	uint8_t log_sector_size = 2;
	while(log_sector_size < 5 && (1 << (7+log_sector_size)) != sector_size_) {
		++log_sector_size;
	}
	if(log_sector_size >= 5) throw Error::InvalidFormat;

	set_geometry(
		sector_count_,
		log_sector_size,
		1,
		sector_count_ > 10 ? Encodings::MFM::Density::High : Encodings::MFM::Density::Double
	);
}